

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

int regstrcmp(SXML_CHAR *str,SXML_CHAR *pattern)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  
  iVar4 = 1;
  if ((str != (SXML_CHAR *)0x0 || pattern != (SXML_CHAR *)0x0) &&
     (iVar4 = 0, str != (SXML_CHAR *)0x0 && pattern != (SXML_CHAR *)0x0)) {
LAB_00106720:
    do {
      bVar2 = *pattern;
      if (bVar2 < 0x3f) {
        if (bVar2 == 0x2a) {
          for (; (bVar2 = *pattern, bVar2 == 0x2a || (bVar2 == 0x3f));
              pattern = (SXML_CHAR *)((byte *)pattern + 1)) {
          }
          str = (SXML_CHAR *)((byte *)str + -1);
          do {
            pbVar1 = (byte *)str + 1;
            str = (SXML_CHAR *)((byte *)str + 1);
            if (*pbVar1 == 0) break;
          } while (*pbVar1 != bVar2);
          goto LAB_00106720;
        }
        if (bVar2 == 0) {
          return (int)(*str == 0);
        }
      }
      else {
        if (bVar2 == 0x3f) {
          pattern = (SXML_CHAR *)((byte *)pattern + 1);
          str = (SXML_CHAR *)((byte *)str + 1);
          goto LAB_00106720;
        }
        if (bVar2 == 0x5c) {
          pattern = (SXML_CHAR *)((byte *)pattern + 1);
        }
      }
      bVar2 = *pattern;
      pattern = (SXML_CHAR *)((byte *)pattern + 1);
      bVar3 = *str;
      str = (SXML_CHAR *)((byte *)str + 1);
    } while (bVar2 == bVar3);
  }
  return iVar4;
}

Assistant:

int regstrcmp(SXML_CHAR* str, SXML_CHAR* pattern)
{
	SXML_CHAR *p, *s;

	if (str == NULL && pattern == NULL)
		return TRUE;

	if (str == NULL || pattern == NULL)
		return FALSE;

	p = pattern;
	s = str;
	for (;;) {
		switch (*p) {
			/* Any character matches, go to next one */
			case C2SX('?'):
				p++;
				s++;
				break;

			/* Go to next character in pattern and wait until it is found in 'str' */
			case C2SX('*'):
				for (; *p != NULC; p++) { /* Squeeze '**?*??**' to '*' */
					if (*p != C2SX('*') && *p != C2SX('?'))
						break;
				}
				for (; *s != NULC; s++) {
					if (*s == *p)
						break;
				}
				break;

			/* NULL character on pattern has to be matched by 'str' */
			case 0:
				return *s ? FALSE : TRUE;

			default:
				if (*p == C2SX('\\')) /* Escape character */
					p++;
				if (*p++ != *s++) /* Characters do not match */
					return FALSE;
				break;
		}
	}

	return FALSE;
}